

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::javanano::MessageGenerator::GenerateStaticVariableInitializers
          (MessageGenerator *this,Printer *printer)

{
  long lVar1;
  long lVar2;
  long lVar3;
  MessageGenerator MStack_58;
  
  lVar3 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(this->descriptor_ + 0x48); lVar2 = lVar2 + 1) {
    lVar1 = *(long *)(this->descriptor_ + 0x50);
    if ((*(char *)(*(long *)(lVar1 + 0x20 + lVar3) + 0x6b) != '\x01') ||
       (*(int *)(*(long *)(lVar1 + 0x10 + lVar3) + 0x8c) != 3)) {
      MessageGenerator(&MStack_58,(Descriptor *)(lVar1 + lVar3),this->params_);
      GenerateStaticVariableInitializers(&MStack_58,printer);
      FieldGeneratorMap::~FieldGeneratorMap(&MStack_58.field_generators_);
    }
    lVar3 = lVar3 + 0xa8;
  }
  return;
}

Assistant:

void MessageGenerator::GenerateStaticVariableInitializers(
    io::Printer* printer) {
  // Generate static member initializers for all nested types.
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
   // TODO(kenton):  Reuse MessageGenerator objects?
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    MessageGenerator(descriptor_->nested_type(i), params_)
      .GenerateStaticVariableInitializers(printer);
  }
}